

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorRotationDriveline.cpp
# Opt level: O3

void __thiscall
chrono::ChLinkMotorRotationDriveline::ArchiveIN
          (ChLinkMotorRotationDriveline *this,ChArchiveIn *marchive)

{
  ChNameValue<std::shared_ptr<chrono::ChShaft>_> local_38;
  
  ChArchiveIn::VersionRead<chrono::ChLinkMotorRotationDriveline>(marchive);
  ChLinkMotorRotation::ArchiveIN(&this->super_ChLinkMotorRotation,marchive);
  local_38._value = (shared_ptr<chrono::ChShaft> *)&(this->super_ChLinkMotorRotation).field_0x278;
  local_38._name = "innershaft1";
  local_38._flags = '\0';
  ChArchiveIn::in<chrono::ChShaft>(marchive,&local_38);
  local_38._value = &this->innershaft2;
  local_38._name = "innershaft2";
  local_38._flags = '\0';
  ChArchiveIn::in<chrono::ChShaft>(marchive,&local_38);
  local_38._value = (shared_ptr<chrono::ChShaft> *)&this->innerconstraint1;
  local_38._name = "innerconstraint1";
  local_38._flags = '\0';
  ChArchiveIn::in<chrono::ChShaftsBody>
            (marchive,(ChNameValue<std::shared_ptr<chrono::ChShaftsBody>_> *)&local_38);
  local_38._value = (shared_ptr<chrono::ChShaft> *)&this->innerconstraint2;
  local_38._name = "innerconstraint2";
  local_38._flags = '\0';
  ChArchiveIn::in<chrono::ChShaftsBody>
            (marchive,(ChNameValue<std::shared_ptr<chrono::ChShaftsBody>_> *)&local_38);
  return;
}

Assistant:

void ChLinkMotorRotationDriveline::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChLinkMotorRotationDriveline>();

    // deserialize parent class
    ChLinkMotorRotation::ArchiveIN(marchive);

    // deserialize all member data:
    marchive >> CHNVP(innershaft1);
    marchive >> CHNVP(innershaft2);
    marchive >> CHNVP(innerconstraint1);
    marchive >> CHNVP(innerconstraint2);
}